

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.hpp
# Opt level: O3

pair<long,_float> __thiscall
re::beatnik::viterbi<float,_256L>::max_delta_element(viterbi<float,_256L> *this,int_t permutation)

{
  ulong uVar1;
  int i;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  pair<long,_float> pVar7;
  
  uVar3 = permutation;
  if (permutation < 1) {
    uVar3 = -permutation;
  }
  fVar6 = 0.0;
  if (uVar3 < 0x80) {
    fVar6 = (this->cache)._M_elems[uVar3];
  }
  fVar6 = (this->delta)._M_elems[0] * fVar6;
  uVar2 = 0;
  uVar3 = 0;
  do {
    uVar1 = -permutation + uVar2;
    uVar4 = -uVar1;
    if (0 < (long)uVar1) {
      uVar4 = uVar1;
    }
    fVar5 = 0.0;
    if (uVar4 < 0x80) {
      fVar5 = (this->cache)._M_elems[uVar4];
    }
    fVar5 = fVar5 * (this->delta)._M_elems[uVar2];
    if (fVar6 < fVar5) {
      uVar3 = uVar2 & 0xffffffff;
      fVar6 = fVar5;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x100);
  pVar7.first = (long)(int)uVar3;
  pVar7.second = fVar6;
  pVar7._12_4_ = 0;
  return pVar7;
}

Assistant:

std::pair<int_t, T>
    max_delta_element(int_t permutation) const noexcept
    {
        T max_value = delta[0] * at(permutation, 0);
        int max_index = 0;
        for (auto i = 0; i < N; ++i) {
            auto product = delta[i] * at(i, permutation);
            if (product > max_value) {
                max_index = i;
                max_value = product;
            }
        }
        return std::make_pair(max_index, max_value);
    }